

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

void __thiscall clunk::Node::GetPawnMoves<true,true>(Node *this,int from,int depth)

{
  uint32_t uVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  Move *pMVar11;
  uint to;
  uint cap;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x617,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  uVar13 = (ulong)(uint)from;
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x618,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  pcVar2 = (char *)(&_board)[uVar13];
  if (pcVar2 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x619,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if (*pcVar2 != '\x03') {
    __assert_fail("_board[from]->type == (color|Pawn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61a,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if ((uint)(byte)pcVar2[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61b,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  uVar3 = GetPinDir(this,true,from);
  uVar6 = 0;
  if (depth == 0) {
    uVar4 = GetDiscoverDir(this,true,from);
    uVar6 = uVar4 + 0x10 & 0xffffffdf;
    if (uVar6 != 0) {
      uVar6 = uVar4;
    }
  }
  uVar7 = (ulong)(from | 8);
  if (*(ulong *)(_pawnCaps + uVar7 * 8) != 0) {
    uVar12 = *(ulong *)(_pawnCaps + uVar7 * 8);
    do {
      if ((uVar12 & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x629,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      uVar4 = (uint)(uVar12 & 0xff);
      to = uVar4 - 1;
      if ((to & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100,"int clunk::Distance(const int, const int)");
      }
      if ((&_dist)[(ulong)to + uVar13 * 0x80] != '\x01') {
        __assert_fail("Distance(from, to) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x62b,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      bVar5 = (&_dir)[(ulong)to + uVar13 * 0x80];
      if (((0x11 < bVar5) || ((0x38002U >> (bVar5 & 0x1f) & 1) == 0)) &&
         ((0x10 < bVar5 - 0xef || ((0x10007U >> (bVar5 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(Direction(from, to))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x62c,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      if ((uVar3 == 0) || (uVar3 == (byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)))) {
        bVar5 = *(byte *)(&_board)[to];
        if ((bVar5 == 0) && ((byte *)(&_board)[to] != _EMPTY)) {
          __assert_fail("cap || (_board[to] == _EMPTY)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x631,
                        "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                       );
        }
        cap = (uint)bVar5;
        if (cap == 0) {
          if (((this->ep != 0x78) && (to == this->ep)) &&
             (bVar14 = EpPinned<true>(from,uVar4 + 0xf), !bVar14)) {
            uVar4 = this->moveCount;
            lVar9 = (long)(int)uVar4;
            if (lVar9 < 0) goto LAB_00131b63;
            if (0x7e < uVar4) goto LAB_00131b82;
            this->moveCount = uVar4 + 1;
            iVar8 = 100;
            cap = 0;
LAB_0013168a:
            iVar10 = 0;
LAB_0013168d:
            pMVar11 = this->moves + lVar9;
            Move::Set(pMVar11,PawnCap,from,to,cap,iVar10,iVar8);
            iVar8 = 0;
            if (pMVar11->bits == this->killer[1].bits) {
              iVar8 = 0x32;
            }
            if (pMVar11->bits == this->killer[0].bits) {
              iVar8 = 0x32;
            }
            Move::IncScore(pMVar11,iVar8);
          }
        }
        else if ((bVar5 & 1) == 0) {
          if (9 < bVar5 - 2) {
            __assert_fail("!pc || IS_CAP(pc)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x114,"int clunk::ValueOf(const int)");
          }
          iVar8 = *(int *)(_VALUE_OF + (ulong)cap * 4);
          if (0x10 < uVar4) {
            uVar4 = this->moveCount;
            lVar9 = (long)(int)uVar4;
            if (-1 < lVar9) {
              if (uVar4 < 0x7f) {
                this->moveCount = uVar4 + 1;
                goto LAB_0013168a;
              }
              goto LAB_00131b82;
            }
            goto LAB_00131b63;
          }
          uVar4 = this->moveCount;
          lVar9 = (long)(int)uVar4;
          if (lVar9 < 0) goto LAB_00131b63;
          if (0x7e < uVar4) goto LAB_00131b82;
          this->moveCount = uVar4 + 1;
          cap = (uint)bVar5;
          Move::Set(this->moves + lVar9,PawnCap,from,to,(uint)bVar5,0xb,iVar8 + 0x3cf);
          uVar1 = this->moves[lVar9].bits;
          iVar10 = 0;
          if (uVar1 == this->killer[1].bits) {
            iVar10 = 0x32;
          }
          if (uVar1 == this->killer[0].bits) {
            iVar10 = 0x32;
          }
          Move::IncScore(this->moves + lVar9,iVar10);
          if (depth == 0) {
            uVar4 = this->moveCount;
            lVar9 = (long)(int)uVar4;
            if (-1 < lVar9) {
              if (uVar4 < 0x7f) {
                this->moveCount = uVar4 + 1;
                Move::Set(this->moves + lVar9,PawnCap,from,to,cap,9,iVar8 + 500);
                uVar1 = this->moves[lVar9].bits;
                iVar10 = 0;
                if (uVar1 == this->killer[1].bits) {
                  iVar10 = 0x32;
                }
                if (uVar1 == this->killer[0].bits) {
                  iVar10 = 0x32;
                }
                Move::IncScore(this->moves + lVar9,iVar10);
                uVar4 = this->moveCount;
                lVar9 = (long)(int)uVar4;
                if (-1 < lVar9) {
                  if (uVar4 < 0x7f) {
                    this->moveCount = uVar4 + 1;
                    Move::Set(this->moves + lVar9,PawnCap,from,to,cap,7,iVar8 + 0x140);
                    uVar1 = this->moves[lVar9].bits;
                    iVar10 = 0;
                    if (uVar1 == this->killer[1].bits) {
                      iVar10 = 0x32;
                    }
                    if (uVar1 == this->killer[0].bits) {
                      iVar10 = 0x32;
                    }
                    Move::IncScore(this->moves + lVar9,iVar10);
                    uVar4 = this->moveCount;
                    lVar9 = (long)(int)uVar4;
                    if (-1 < lVar9) {
                      if (uVar4 < 0x7f) {
                        iVar8 = iVar8 + 300;
                        this->moveCount = uVar4 + 1;
                        iVar10 = 5;
                        goto LAB_0013168d;
                      }
                      goto LAB_00131b82;
                    }
                    goto LAB_00131b63;
                  }
                  goto LAB_00131b82;
                }
                goto LAB_00131b63;
              }
              goto LAB_00131b82;
            }
            goto LAB_00131b63;
          }
        }
      }
      bVar14 = 0xff < uVar12;
      uVar12 = uVar12 >> 8;
    } while (bVar14);
  }
  if ((uint)from >> 4 == 1 || depth == 0) {
    uVar4 = from - 0x10;
    if (uVar3 != 0) {
      if (0x7f < uVar4) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x107,"int clunk::Direction(const int, const int)");
      }
      bVar5 = (char)(&_dir)[(ulong)uVar4 + uVar13 * 0x80] >> 7;
      if (uVar3 != (byte)(((&_dir)[(ulong)uVar4 + uVar13 * 0x80] ^ bVar5) - bVar5)) {
        return;
      }
    }
    if ((undefined *)(&_board)[(int)uVar4] == _EMPTY) {
      if (from - 1U < 0x1f) {
        uVar6 = this->moveCount;
        if (-1 < (long)(int)uVar6) {
          if (uVar6 < 0x7f) {
            this->moveCount = uVar6 + 1;
            pMVar11 = this->moves + (int)uVar6;
            Move::Set(pMVar11,PawnMove,from,uVar4,0,0xb,0x3cf);
            iVar8 = 0;
            if (pMVar11->bits == this->killer[1].bits) {
              iVar8 = 0x32;
            }
            if (pMVar11->bits == this->killer[0].bits) {
              iVar8 = 0x32;
            }
            Move::IncScore(pMVar11,iVar8);
            if (depth != 0) {
              return;
            }
            uVar6 = this->moveCount;
            lVar9 = (long)(int)uVar6;
            if (lVar9 < 0) goto LAB_00131b63;
            if (uVar6 < 0x7f) {
              this->moveCount = uVar6 + 1;
              Move::Set(this->moves + lVar9,PawnMove,from,uVar4,0,9,500);
              uVar1 = this->moves[lVar9].bits;
              iVar8 = 0;
              if (uVar1 == this->killer[1].bits) {
                iVar8 = 0x32;
              }
              if (uVar1 == this->killer[0].bits) {
                iVar8 = 0x32;
              }
              Move::IncScore(this->moves + lVar9,iVar8);
              uVar6 = this->moveCount;
              lVar9 = (long)(int)uVar6;
              if (lVar9 < 0) goto LAB_00131b63;
              if (uVar6 < 0x7f) {
                this->moveCount = uVar6 + 1;
                Move::Set(this->moves + lVar9,PawnMove,from,uVar4,0,7,0x140);
                uVar1 = this->moves[lVar9].bits;
                iVar8 = 0;
                if (uVar1 == this->killer[1].bits) {
                  iVar8 = 0x32;
                }
                if (uVar1 == this->killer[0].bits) {
                  iVar8 = 0x32;
                }
                Move::IncScore(this->moves + lVar9,iVar8);
                uVar6 = this->moveCount;
                lVar9 = (long)(int)uVar6;
                if (lVar9 < 0) goto LAB_00131b63;
                if (uVar6 < 0x7f) {
                  this->moveCount = uVar6 + 1;
                  Move::Set(this->moves + lVar9,PawnMove,from,uVar4,0,5,300);
                  uVar1 = this->moves[lVar9].bits;
                  iVar8 = 0;
                  if (uVar1 == this->killer[1].bits) {
                    iVar8 = 0x32;
                  }
                  if (uVar1 == this->killer[0].bits) {
                    iVar8 = 0x32;
                  }
                  Move::IncScore(this->moves + lVar9,iVar8);
                  return;
                }
              }
            }
          }
LAB_00131b82:
          __assert_fail("(moveCount + 1) < MaxMoves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x60e,
                        "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                       );
        }
LAB_00131b63:
        __assert_fail("moveCount >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x60d,
                      "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                     );
      }
      if (depth != 0) {
        __assert_fail("!depth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x658,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      if ((from - 0x1fU == (uint)(byte)_KING[1] || from - 0x21U == (uint)(byte)_KING[1]) ||
          uVar6 != 0) {
        uVar3 = this->moveCount;
        if ((long)(int)uVar3 < 0) goto LAB_00131b63;
        if (0x7e < uVar3) goto LAB_00131b82;
        iVar8 = *(int *)(_DIR_SHIFT + (long)from * 4 + 0x70);
        iVar10 = *(int *)(_PAWN_SQR + uVar7 * 4);
        this->moveCount = uVar3 + 1;
        pMVar11 = this->moves + (int)uVar3;
        Move::Set(pMVar11,PawnMove,from,uVar4,0,0,(iVar8 - iVar10) + 0x19);
        iVar8 = 0;
        if (pMVar11->bits == this->killer[1].bits) {
          iVar8 = 0x32;
        }
        if (pMVar11->bits == this->killer[0].bits) {
          iVar8 = 0x32;
        }
        Move::IncScore(pMVar11,iVar8);
      }
      if ((((uint)from >> 4 == 6) && ((undefined *)(&_board)[from - 0x20U] == _EMPTY)) &&
         (uVar6 != 0 ||
          (from - 0x2fU == (uint)(byte)_KING[1] || from - 0x31U == (uint)(byte)_KING[1]))) {
        AddMove(this,PawnLung,from,from - 0x20U,
                (*(int *)(_PAWN_SQR + (ulong)(from - 0x18) * 4) - *(int *)(_PAWN_SQR + uVar7 * 4)) +
                0x1e,0,0);
      }
    }
  }
  return;
}

Assistant:

void GetPawnMoves(const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Pawn));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    int to;

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
      if (abs(kdir) == North) {
        kdir = 0;
      }
    }

    for (uint64_t mvs = _pawnCaps[from + (color * 8)]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        continue;
      }
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if ((ep != None) && (to == ep) &&
            !EpPinned<color>(from, (ep + (color ? North : South))))
        {
          AddMove(PawnCap, from, to, PawnValue);
        }
      }
      else if (COLOR(cap) != color) {
        score = ValueOf(cap);
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnCap, from, to, (score + QueenValue),  cap, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnCap, from, to, (score + RookValue),   cap, (color|Rook));
            AddMove(PawnCap, from, to, (score + BishopValue), cap, (color|Bishop));
            AddMove(PawnCap, from, to, (score + KnightValue), cap, (color|Knight));
          }
        }
        else {
          AddMove(PawnCap, from, to, score, cap);
        }
      }
    }
    if (!qsearch || ((!depth) | (YC(from) == (color ? 1 : 6)))) {
      to = (from + (color ? South : North));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        return;
      }
      if (_board[to] == _EMPTY) {
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnMove, from, to, QueenValue,  0, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnMove, from, to, RookValue,   0, (color|Rook));
            AddMove(PawnMove, from, to, BishopValue, 0, (color|Bishop));
            AddMove(PawnMove, from, to, KnightValue, 0, (color|Knight));
          }
        }
        else {
          if (qsearch) {
            assert(!depth);
            if (kdir |
                ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
            {
              score = (_PAWN_SQR[to + (8 * color)] -
                       _PAWN_SQR[from + (8 * color)] + 25);
              AddMove(PawnMove, from, to, score);
            }
          }
          else {
            score = (_PAWN_SQR[to + (8 * color)] -
                     _PAWN_SQR[from + (8 * color)] + 5);
            AddMove(PawnMove, from, to, score);
          }
          if (YC(from) == (color ? 6 : 1)) {
            to += (color ? South : North);
            assert(IS_SQUARE(to));
            if (_board[to] == _EMPTY) {
              if (qsearch) {
                assert(!depth);
                if (kdir |
                    ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                    ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
                {
                  score = (_PAWN_SQR[to + (8 * color)] -
                           _PAWN_SQR[from + (8 * color)] + 30);
                  AddMove(PawnLung, from, to, score);
                }
              }
              else {
                score = (_PAWN_SQR[to + (8 * color)] -
                         _PAWN_SQR[from + (8 * color)] + 10);
                AddMove(PawnLung, from, to, score);
              }
            }
          }
        }
      }
    }
  }